

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O0

void __thiscall
MockMemoryReportFormatter::report_testgroup_end
          (MockMemoryReportFormatter *this,TestResult *result,UtestShell *test)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  MockActualCall *this_00;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58 [2];
  SimpleString local_38;
  TemporaryDefaultNewAllocator local_28;
  TemporaryDefaultNewAllocator tempAlloc;
  UtestShell *test_local;
  TestResult *result_local;
  MockMemoryReportFormatter *this_local;
  
  tempAlloc.newAllocator = (TestMemoryAllocator *)test;
  TemporaryDefaultNewAllocator::TemporaryDefaultNewAllocator(&local_28,previousNewAllocator);
  SimpleString::SimpleString(&local_38,"formatter");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_58,"report_testgroup_end");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,local_58);
  SimpleString::SimpleString(&local_68,"result");
  this_00 = MockActualCall::withParameter
                      ((MockActualCall *)CONCAT44(extraout_var,iVar1),&local_68,result);
  SimpleString::SimpleString(&local_78,"test");
  MockActualCall::withParameter(this_00,&local_78,tempAlloc.newAllocator);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(local_58);
  SimpleString::~SimpleString(&local_38);
  TemporaryDefaultNewAllocator::~TemporaryDefaultNewAllocator(&local_28);
  return;
}

Assistant:

virtual void report_testgroup_end(TestResult* result, UtestShell& test) _override
    {
        TemporaryDefaultNewAllocator tempAlloc(previousNewAllocator);
        mock("formatter").actualCall("report_testgroup_end").withParameter("result", result).withParameter("test", &test);
    }